

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O2

void __thiscall
TPZSparseBlockDiagonal<long_double>::FindBlockIndex
          (TPZSparseBlockDiagonal<long_double> *this,int64_t glob,int64_t *block,int64_t *blockind)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int64_t iVar6;
  
  lVar1 = (this->fBlockIndex).fNElements;
  plVar2 = (this->fBlockIndex).fStore;
  lVar3 = 2;
  if (2 < lVar1) {
    lVar3 = lVar1;
  }
  lVar1 = 0;
  do {
    lVar4 = lVar1;
    if (lVar4 == lVar3 + -2) {
      *block = -1;
      iVar6 = -1;
LAB_00d6735f:
      *blockind = iVar6;
      return;
    }
    for (lVar5 = plVar2[lVar4]; lVar1 = lVar4 + 1, lVar5 < plVar2[lVar4 + 1]; lVar5 = lVar5 + 1) {
      if ((this->fBlock).fStore[lVar5] == glob) {
        *block = lVar4;
        iVar6 = lVar5 - plVar2[lVar4];
        goto LAB_00d6735f;
      }
    }
  } while( true );
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::AddBlock(int64_t i, TPZFMatrix<TVar>& block)
{
    TPZBlockDiagonal<TVar>::AddBlock(i, block);
}